

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O0

bool __thiscall
OPNMIDIplay::doUniversalSysEx(OPNMIDIplay *this,uint dev,bool realtime,uint8_t *data,size_t size)

{
  byte bVar1;
  uint uVar2;
  OPN2 *pOVar3;
  size_type sVar4;
  bool bVar5;
  ulong local_48;
  size_t ch;
  uint volume;
  uint address;
  bool devicematch;
  size_t size_local;
  uint8_t *data_local;
  bool realtime_local;
  uint dev_local;
  OPNMIDIplay *this_local;
  
  bVar5 = true;
  if (dev != 0x7f) {
    bVar5 = dev == this->m_sysExDeviceId;
  }
  if ((size < 2) || (!bVar5)) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = (realtime & 1) << 0x10 | (*data & 0x7f) << 8 | data[1] & 0x7f;
    if (uVar2 == 0x901) {
      if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
        (*(this->hooks).onDebugMessage)((this->hooks).onDebugMessage_userData,"SysEx: GM System On")
        ;
      }
      this->m_synthMode = 0;
      realTime_ResetState(this);
      this_local._7_1_ = true;
    }
    else if (uVar2 == 0x902) {
      if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
        (*(this->hooks).onDebugMessage)
                  ((this->hooks).onDebugMessage_userData,"SysEx: GM System Off");
      }
      this->m_synthMode = 2;
      realTime_ResetState(this);
      this_local._7_1_ = true;
    }
    else if ((uVar2 == 0x10401) && (size == 4)) {
      bVar1 = data[3];
      pOVar3 = AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::get(&this->m_synth);
      if (pOVar3 != (OPN2 *)0x0) {
        pOVar3 = AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::operator->(&this->m_synth);
        pOVar3->m_masterVolume = bVar1 & 0x7f;
      }
      for (local_48 = 0;
          sVar4 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
                  size(&this->m_midiChannels), local_48 < sVar4; local_48 = local_48 + 1) {
        noteUpdateAll(this,local_48 & 0xffff,4);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool OPNMIDIplay::doUniversalSysEx(unsigned dev, bool realtime, const uint8_t *data, size_t size)
{
    bool devicematch = dev == 0x7F || dev == m_sysExDeviceId;
    if(size < 2 || !devicematch)
        return false;

    unsigned address =
        (((unsigned)data[0] & 0x7F) << 8) |
        (((unsigned)data[1] & 0x7F));
    data += 2;
    size -= 2;

    switch(((unsigned)realtime << 16) | address)
    {
        case (0 << 16) | 0x0901: // GM System On
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: GM System On");
            m_synthMode = Mode_GM;
            realTime_ResetState();
            return true;
        case (0 << 16) | 0x0902: // GM System Off
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: GM System Off");
            m_synthMode = Mode_XG;//TODO: TEMPORARY, make something RIGHT
            realTime_ResetState();
            return true;
        case (1 << 16) | 0x0401: // MIDI Master Volume
            if(size != 2)
                break;
            unsigned volume =
                (((unsigned)data[0] & 0x7F)) |
                (((unsigned)data[1] & 0x7F) << 7);
            if(m_synth.get())
                m_synth->m_masterVolume = static_cast<uint8_t>(volume >> 7);
            for(size_t ch = 0; ch < m_midiChannels.size(); ch++)
                noteUpdateAll(uint16_t(ch), Upd_Volume);
            return true;
    }

    return false;
}